

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O3

void __thiscall
TaskSpec::TaskSpec(TaskSpec *this,uint64_t id,string *conn_id,string *request_str,uint64_t epoch_ms,
                  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                  *locks)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->id_ = id;
  paVar1 = &(this->conn_id_).field_2;
  (this->conn_id_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (conn_id->_M_dataplus)._M_p;
  paVar2 = &conn_id->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&conn_id->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->conn_id_).field_2 + 8) = uVar4;
  }
  else {
    (this->conn_id_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->conn_id_)._M_string_length = conn_id->_M_string_length;
  (conn_id->_M_dataplus)._M_p = (pointer)paVar2;
  conn_id->_M_string_length = 0;
  (conn_id->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->request_str_).field_2;
  (this->request_str_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (request_str->_M_dataplus)._M_p;
  paVar2 = &request_str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&request_str->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->request_str_).field_2 + 8) = uVar4;
  }
  else {
    (this->request_str_)._M_dataplus._M_p = pcVar3;
    (this->request_str_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->request_str_)._M_string_length = request_str->_M_string_length;
  (request_str->_M_dataplus)._M_p = (pointer)paVar2;
  request_str->_M_string_length = 0;
  (request_str->field_2)._M_local_buf[0] = '\0';
  this->epoch_ms_ = epoch_ms;
  (this->work_estimated_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->work_done_).super___atomic_base<unsigned_long>._M_i = 0;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(&this->locks_,locks);
  return;
}

Assistant:

TaskSpec(uint64_t id, std::string conn_id, std::string request_str,
             uint64_t epoch_ms, std::vector<DatabaseLock> locks)
        : id_(id),
          conn_id_(std::move(conn_id)),
          request_str_(std::move(request_str)),
          epoch_ms_(epoch_ms),
          work_estimated_(0),
          work_done_(0),
          locks_(locks) {}